

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

token * skiwi::anon_unknown_2::take
                  (token *__return_storage_ptr__,
                  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  pointer pcVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  token *extraout_RAX;
  pointer ptVar4;
  
  ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
      super__Vector_impl_data._M_start == ptVar4) {
    throw_parse_error(no_tokens);
    ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  __return_storage_ptr__->type = ptVar4[-1].type;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  pcVar1 = ptVar4[-1].value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->value,pcVar1,
             pcVar1 + ptVar4[-1].value._M_string_length);
  iVar2 = ptVar4[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar4[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar2;
  (anonymous_namespace)::popped_token = __return_storage_ptr__->type;
  std::__cxx11::string::_M_assign((string *)&DAT_002a8798);
  _DAT_002a87b8 = __return_storage_ptr__->line_nr;
  unique0x00012004 = __return_storage_ptr__->column_nr;
  ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_finish = ptVar4 + -1;
  pcVar1 = ptVar4[-1].value._M_dataplus._M_p;
  paVar3 = &ptVar4[-1].value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return extraout_RAX;
  }
  return (token *)paVar3;
}

Assistant:

token take(std::vector<token>& tokens)
    {
    if (tokens.empty())
      {
      throw_parse_error(no_tokens);
      }
    token t = tokens.back();
    popped_token = t;
    tokens.pop_back();
    return t;
    }